

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

Bit8u NOPN2_Read(ym3438_t *chip,Bit32u port)

{
  Bit16s *pBVar1;
  byte bVar2;
  byte bVar4;
  Bit32u BVar3;
  
  if (((port & 3) == 0) || ((chip->chip_type & 2) != 0)) {
    if (chip->mode_test_21[6] == '\0') {
      bVar2 = chip->timer_b_overflow_flag * '\x02' | chip->busy << 7 | chip->timer_a_overflow_flag;
    }
    else {
      if (chip->mode_test_2c[4] == '\0') {
        pBVar1 = chip->fm_out + (chip->cycles + 0x12) % 0x18;
        bVar4 = 0x3f;
      }
      else {
        pBVar1 = &chip->ch_read;
        bVar4 = 1;
      }
      bVar2 = (byte)*pBVar1;
      if (chip->mode_test_21[7] == '\0') {
        bVar2 = bVar4 & (byte)((ushort)*pBVar1 >> 8) |
                (byte)(((chip->eg_read[chip->mode_test_21[0]] & 1) << 0xe) >> 8) |
                (byte)((chip->pg_read << 0xf) >> 8);
      }
    }
    chip->status = bVar2;
    BVar3 = 300000;
    if ((chip->chip_type & 1) == 0) {
      BVar3 = 40000000;
    }
    chip->status_time = BVar3;
  }
  if (chip->status_time != 0) {
    return chip->status;
  }
  return '\0';
}

Assistant:

Bit8u NOPN2_Read(ym3438_t *chip, Bit32u port)
{
    if ((port & 3) == 0 || (chip->chip_type & ym3438_mode_readmode))
    {
        if (chip->mode_test_21[6])
        {
            /* Read test data */
            Bit32u slot = (chip->cycles + 18) % 24;
            Bit16u testdata = ((chip->pg_read & 0x01) << 15)
                            | ((chip->eg_read[chip->mode_test_21[0]] & 0x01) << 14);
            if (chip->mode_test_2c[4])
            {
                testdata |= chip->ch_read & 0x1ff;
            }
            else
            {
                testdata |= chip->fm_out[slot] & 0x3fff;
            }
            if (chip->mode_test_21[7])
            {
                chip->status = testdata & 0xff;
            }
            else
            {
                chip->status = testdata >> 8;
            }
        }
        else
        {
            chip->status = (chip->busy << 7) | (chip->timer_b_overflow_flag << 1)
                 | chip->timer_a_overflow_flag;
        }
        if (chip->chip_type & ym3438_mode_ym2612)
        {
            chip->status_time = 300000;
        }
        else
        {
            chip->status_time = 40000000;
        }
    }
    if (chip->status_time)
    {
        return chip->status;
    }
    return 0;
}